

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetWindowCollapsed(char *name,bool collapsed,ImGuiCond cond)

{
  ImGuiWindow *pIVar1;
  
  pIVar1 = FindWindowByName(name);
  if ((pIVar1 != (ImGuiWindow *)0x0) &&
     (cond == 0 || (pIVar1->SetWindowCollapsedAllowFlags & cond) != 0)) {
    pIVar1->SetWindowCollapsedAllowFlags = pIVar1->SetWindowCollapsedAllowFlags & 0xfffffff1;
    pIVar1->Collapsed = collapsed;
  }
  return;
}

Assistant:

void ImGui::SetWindowCollapsed(const char* name, bool collapsed, ImGuiCond cond)
{
    ImGuiWindow* window = FindWindowByName(name);
    if (window)
        SetWindowCollapsed(window, collapsed, cond);
}